

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

int google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
              (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  Type TVar2;
  uint32 uVar3;
  int iVar4;
  UnknownField *this;
  int field_size;
  UnknownField *field;
  int i;
  int size;
  UnknownFieldSet *unknown_fields_local;
  
  field._4_4_ = 0;
  field._0_4_ = 0;
  while( true ) {
    iVar1 = UnknownFieldSet::field_count(unknown_fields);
    if (iVar1 <= (int)field) break;
    this = UnknownFieldSet::field(unknown_fields,(int)field);
    TVar2 = UnknownField::type(this);
    if (TVar2 == TYPE_LENGTH_DELIMITED) {
      uVar3 = UnknownField::number(this);
      iVar1 = io::CodedOutputStream::VarintSize32(uVar3);
      uVar3 = UnknownField::GetLengthDelimitedSize(this);
      iVar4 = io::CodedOutputStream::VarintSize32(uVar3);
      field._4_4_ = uVar3 + iVar4 + iVar1 + field._4_4_ + 4;
    }
    field._0_4_ = (int)field + 1;
  }
  return field._4_4_;
}

Assistant:

int WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  int size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}